

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O1

void __thiscall front::symbol::VoidSymbol::~VoidSymbol(VoidSymbol *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR___cxa_pure_virtual_001efa58;
  pcVar2 = (this->super_Symbol)._name._M_dataplus._M_p;
  paVar1 = &(this->super_Symbol)._name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~VoidSymbol() {}